

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O2

char * ap_str_find_first_char_from_set(char *str,char *set)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar2 = strlen(str);
  sVar3 = strlen(set);
  sVar4 = 0;
  do {
    if (sVar4 == sVar2) {
      return (char *)0x0;
    }
    sVar5 = 0;
    while (sVar3 != sVar5) {
      pcVar1 = set + sVar5;
      sVar5 = sVar5 + 1;
      if (str[sVar4] == *pcVar1) {
        return str + sVar4;
      }
    }
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

char * ap_str_find_first_char_from_set (char *str, const char *set)
{
	size_t str_len;
	size_t set_len;
	size_t i;
	size_t j;

	str_len = strlen (str);
	set_len = strlen (set);

	for (i = 0; i < str_len; i ++)
	{
		for (j = 0; j < set_len; j ++)
		{
			if (str[i] == set[j])
			{
				return str + i;
			}
		}
	}

	return NULL;
}